

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiInAlsa::openPort(MidiInAlsa *this,uint portNumber,string *portName)

{
  undefined8 *puVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  snd_seq_t *seq;
  undefined8 uVar4;
  char *pcVar5;
  size_type sVar6;
  long *plVar7;
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  long lVar11;
  size_t sVar12;
  ostream *poVar13;
  _Alloc_hider _Var14;
  snd_seq_port_info_t *psVar15;
  undefined8 uStack_2c0;
  snd_seq_port_info_t asStack_2b8 [8];
  undefined1 local_2b0 [8];
  ostringstream ost;
  ios_base local_240 [264];
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  undefined1 uStack_77;
  undefined6 uStack_76;
  snd_seq_addr_t sender;
  long local_68 [2];
  string local_58;
  undefined1 local_32;
  undefined1 local_31;
  snd_seq_addr_t receiver;
  
  psVar15 = asStack_2b8;
  if ((this->super_MidiInApi).super_MidiApi.connected_ == true) {
    uStack_2c0 = 0x10d443;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,
               (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length,0x110b44)
    ;
    pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
    uStack_2c0 = 0x10d468;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar2,
               pcVar2 + (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length);
    uStack_2c0 = 0x10d475;
    MidiApi::error((MidiApi *)this,WARNING,&local_138);
    local_118.field_2._M_allocated_capacity = local_138.field_2._M_allocated_capacity;
    _Var14._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) {
      return;
    }
  }
  else {
    uStack_2c0 = 0x10d4a0;
    iVar8 = (*(this->super_MidiInApi).super_MidiApi._vptr_MidiApi[8])(this);
    if (iVar8 != 0) {
      uStack_2c0 = 0x10d4ad;
      lVar11 = snd_seq_port_info_sizeof();
      lVar11 = -(lVar11 + 0xfU & 0xfffffffffffffff0);
      psVar15 = asStack_2b8 + lVar11;
      *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d4c3;
      sVar12 = snd_seq_port_info_sizeof();
      *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d4d0;
      memset(psVar15,0,sVar12);
      puVar3 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
      seq = (snd_seq_t *)*puVar3;
      *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d4e8;
      uVar9 = portInfo(seq,psVar15,0x21,portNumber);
      if (uVar9 == 0) {
        *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d684;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
        *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d698;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2b0,"MidiInAlsa::openPort: the \'portNumber\' argument (",0x31);
        *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d6a7;
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
        *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d6bb;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,") is invalid.",0xd);
        *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d6cb;
        std::__cxx11::stringbuf::str();
        *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d6db;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_MidiInApi).super_MidiApi.errorString_,&local_78);
        plVar7 = (long *)CONCAT62(uStack_76,CONCAT11(uStack_77,local_78));
        if (plVar7 != local_68) {
          *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d6f3;
          operator_delete(plVar7,local_68[0] + 1);
        }
        pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
        sVar6 = (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d70f;
        std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar2,pcVar2 + sVar6);
        *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d720;
        MidiApi::error((MidiApi *)this,INVALID_PARAMETER,&local_58);
        _Var14._M_p = local_58._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d735;
          operator_delete(_Var14._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d748;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
        *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d754;
        std::ios_base::~ios_base(local_240);
        return;
      }
      *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d4f8;
      local_78 = (string)snd_seq_port_info_get_client(psVar15);
      *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d503;
      uStack_77 = snd_seq_port_info_get_port(psVar15);
      uVar4 = *puVar3;
      *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d50f;
      local_32 = snd_seq_client_id(uVar4);
      *(undefined8 *)(asStack_2b8 + lVar11 + -8) = 0x10d517;
      lVar11 = snd_seq_port_info_sizeof();
      psVar15 = psVar15 + -(lVar11 + 0xfU & 0xfffffffffffffff0);
      *(undefined8 *)(psVar15 + -8) = 0x10d52d;
      sVar12 = snd_seq_port_info_sizeof();
      *(undefined8 *)(psVar15 + -8) = 0x10d53a;
      memset(psVar15,0,sVar12);
      if (*(int *)((long)puVar3 + 0xc) < 0) {
        *(undefined8 *)(psVar15 + -8) = 0x10d54f;
        snd_seq_port_info_set_client(psVar15,0);
        *(undefined8 *)(psVar15 + -8) = 0x10d559;
        snd_seq_port_info_set_port(psVar15,0);
        *(undefined8 *)(psVar15 + -8) = 0x10d566;
        snd_seq_port_info_set_capability(psVar15,0x42);
        *(undefined8 *)(psVar15 + -8) = 0x10d573;
        snd_seq_port_info_set_type(psVar15,0x100002);
        *(undefined8 *)(psVar15 + -8) = 0x10d580;
        snd_seq_port_info_set_midi_channels(psVar15,0x10);
        *(undefined8 *)(psVar15 + -8) = 0x10d58d;
        snd_seq_port_info_set_timestamping(psVar15,1);
        *(undefined8 *)(psVar15 + -8) = 0x10d59a;
        snd_seq_port_info_set_timestamp_real(psVar15,1);
        uVar10 = *(undefined4 *)(puVar3 + 9);
        *(undefined8 *)(psVar15 + -8) = 0x10d5a6;
        snd_seq_port_info_set_timestamp_queue(psVar15,uVar10);
        pcVar2 = (portName->_M_dataplus)._M_p;
        *(undefined8 *)(psVar15 + -8) = 0x10d5b1;
        snd_seq_port_info_set_name(psVar15,pcVar2);
        uVar4 = *puVar3;
        *(undefined8 *)(psVar15 + -8) = 0x10d5bd;
        iVar8 = snd_seq_create_port(uVar4);
        *(int *)((long)puVar3 + 0xc) = iVar8;
        if (iVar8 < 0) {
          pcVar5 = (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
          *(undefined8 *)(psVar15 + -8) = 0x10d938;
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,pcVar5,0x110bf0);
          pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
          sVar6 = (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          *(undefined8 *)(psVar15 + -8) = 0x10d95d;
          std::__cxx11::string::_M_construct<char*>((string *)&local_f8,pcVar2,pcVar2 + sVar6);
          *(undefined8 *)(psVar15 + -8) = 0x10d96d;
          MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_f8);
          local_118.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
          _Var14._M_p = local_f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
            return;
          }
          goto LAB_0010d65e;
        }
        *(undefined8 *)(psVar15 + -8) = 0x10d5d1;
        uVar10 = snd_seq_port_info_get_port(psVar15);
        *(undefined4 *)((long)puVar3 + 0xc) = uVar10;
      }
      local_31 = *(undefined1 *)((long)puVar3 + 0xc);
      if (puVar3[2] == 0) {
        puVar1 = puVar3 + 2;
        *(undefined8 *)(psVar15 + -8) = 0x10d765;
        iVar8 = snd_seq_port_subscribe_malloc(puVar1);
        if (iVar8 < 0) {
          pcVar5 = (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
          *(undefined8 *)(psVar15 + -8) = 0x10d9a5;
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,pcVar5,0x110c26);
          pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
          sVar6 = (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          *(undefined8 *)(psVar15 + -8) = 0x10d9ca;
          std::__cxx11::string::_M_construct<char*>((string *)&local_d8,pcVar2,pcVar2 + sVar6);
          *(undefined8 *)(psVar15 + -8) = 0x10d9da;
          MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_d8);
          local_118.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
          _Var14._M_p = local_d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
            return;
          }
          goto LAB_0010d65e;
        }
        uVar4 = puVar3[2];
        *(undefined8 *)(psVar15 + -8) = 0x10d77a;
        snd_seq_port_subscribe_set_sender(uVar4,&local_78);
        uVar4 = puVar3[2];
        *(undefined8 *)(psVar15 + -8) = 0x10d787;
        snd_seq_port_subscribe_set_dest(uVar4,&local_32);
        uVar4 = *puVar3;
        *(undefined8 *)(psVar15 + -8) = 0x10d794;
        iVar8 = snd_seq_subscribe_port(uVar4);
        if (iVar8 != 0) {
          uVar4 = *puVar1;
          *(undefined8 *)(psVar15 + -8) = 0x10d7a4;
          snd_seq_port_subscribe_free(uVar4);
          *puVar1 = 0;
          pcVar5 = (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
          *(undefined8 *)(psVar15 + -8) = 0x10d7c7;
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,pcVar5,0x110c65);
          pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
          sVar6 = (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          *(undefined8 *)(psVar15 + -8) = 0x10d7ec;
          std::__cxx11::string::_M_construct<char*>((string *)&local_b8,pcVar2,pcVar2 + sVar6);
          *(undefined8 *)(psVar15 + -8) = 0x10d7fc;
          MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_b8);
          local_118.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
          _Var14._M_p = local_b8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
            return;
          }
          goto LAB_0010d65e;
        }
      }
      if ((this->super_MidiInApi).inputData_.doInput == false) {
        uVar4 = *puVar3;
        uVar10 = *(undefined4 *)(puVar3 + 9);
        *(undefined8 *)(psVar15 + -8) = 0x10d833;
        snd_seq_control_queue(uVar4,uVar10,0x1e,0,0);
        uVar4 = *puVar3;
        *(undefined8 *)(psVar15 + -8) = 0x10d83c;
        snd_seq_drain_output(uVar4);
        *(undefined8 *)(psVar15 + -8) = 0x10d84b;
        pthread_attr_init((pthread_attr_t *)local_2b0);
        *(undefined8 *)(psVar15 + -8) = 0x10d855;
        pthread_attr_setdetachstate((pthread_attr_t *)local_2b0,0);
        *(undefined8 *)(psVar15 + -8) = 0x10d85f;
        pthread_attr_setschedpolicy((pthread_attr_t *)local_2b0,0);
        (this->super_MidiInApi).inputData_.doInput = true;
        *(undefined8 *)(psVar15 + -8) = 0x10d87c;
        iVar8 = pthread_create(puVar3 + 6,(pthread_attr_t *)local_2b0,alsaMidiHandler,
                               &(this->super_MidiInApi).inputData_);
        *(undefined8 *)(psVar15 + -8) = 0x10d887;
        pthread_attr_destroy((pthread_attr_t *)local_2b0);
        if (iVar8 != 0) {
          uVar4 = *puVar3;
          *(undefined8 *)(psVar15 + -8) = 0x10d89d;
          snd_seq_unsubscribe_port(uVar4);
          uVar4 = puVar3[2];
          *(undefined8 *)(psVar15 + -8) = 0x10d8a6;
          snd_seq_port_subscribe_free(uVar4);
          puVar3[2] = 0;
          (this->super_MidiInApi).inputData_.doInput = false;
          pcVar5 = (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
          *(undefined8 *)(psVar15 + -8) = 0x10d8d1;
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,pcVar5,0x110c9e);
          pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
          sVar6 = (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          *(undefined8 *)(psVar15 + -8) = 0x10d8f3;
          std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar2,pcVar2 + sVar6);
          *(undefined8 *)(psVar15 + -8) = 0x10d903;
          MidiApi::error((MidiApi *)this,THREAD_ERROR,&local_98);
          local_118.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
          _Var14._M_p = local_98._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p == &local_98.field_2) {
            return;
          }
          goto LAB_0010d65e;
        }
      }
      (this->super_MidiInApi).super_MidiApi.connected_ = true;
      return;
    }
    uStack_2c0 = 0x10d616;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,
               (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length,0x110b7d)
    ;
    pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
    uStack_2c0 = 0x10d63b;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar2,
               pcVar2 + (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length);
    uStack_2c0 = 0x10d64b;
    MidiApi::error((MidiApi *)this,NO_DEVICES_FOUND,&local_118);
    psVar15 = asStack_2b8;
    _Var14._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) {
      return;
    }
  }
LAB_0010d65e:
  *(undefined8 *)(psVar15 + -8) = 0x10d666;
  operator_delete(_Var14._M_p,local_118.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void MidiInAlsa :: openPort( unsigned int portNumber, const std::string &portName )
{
  if ( connected_ ) {
    errorString_ = "MidiInAlsa::openPort: a valid connection already exists!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  unsigned int nSrc = this->getPortCount();
  if ( nSrc < 1 ) {
    errorString_ = "MidiInAlsa::openPort: no MIDI input sources found!";
    error( RtMidiError::NO_DEVICES_FOUND, errorString_ );
    return;
  }

  snd_seq_port_info_t *src_pinfo;
  snd_seq_port_info_alloca( &src_pinfo );
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( portInfo( data->seq, src_pinfo, SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ, (int) portNumber ) == 0 ) {
    std::ostringstream ost;
    ost << "MidiInAlsa::openPort: the 'portNumber' argument (" << portNumber << ") is invalid.";
    errorString_ = ost.str();
    error( RtMidiError::INVALID_PARAMETER, errorString_ );
    return;
  }

  snd_seq_addr_t sender, receiver;
  sender.client = snd_seq_port_info_get_client( src_pinfo );
  sender.port = snd_seq_port_info_get_port( src_pinfo );
  receiver.client = snd_seq_client_id( data->seq );

  snd_seq_port_info_t *pinfo;
  snd_seq_port_info_alloca( &pinfo );
  if ( data->vport < 0 ) {
    snd_seq_port_info_set_client( pinfo, 0 );
    snd_seq_port_info_set_port( pinfo, 0 );
    snd_seq_port_info_set_capability( pinfo,
                                      SND_SEQ_PORT_CAP_WRITE |
                                      SND_SEQ_PORT_CAP_SUBS_WRITE );
    snd_seq_port_info_set_type( pinfo,
                                SND_SEQ_PORT_TYPE_MIDI_GENERIC |
                                SND_SEQ_PORT_TYPE_APPLICATION );
    snd_seq_port_info_set_midi_channels(pinfo, 16);
#ifndef AVOID_TIMESTAMPING
    snd_seq_port_info_set_timestamping( pinfo, 1 );
    snd_seq_port_info_set_timestamp_real( pinfo, 1 );
    snd_seq_port_info_set_timestamp_queue( pinfo, data->queue_id );
#endif
    snd_seq_port_info_set_name( pinfo,  portName.c_str() );
    data->vport = snd_seq_create_port( data->seq, pinfo );

    if ( data->vport < 0 ) {
      errorString_ = "MidiInAlsa::openPort: ALSA error creating input port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    data->vport = snd_seq_port_info_get_port( pinfo );
  }

  receiver.port = data->vport;

  if ( !data->subscription ) {
    // Make subscription
    if ( snd_seq_port_subscribe_malloc( &data->subscription ) < 0 ) {
      errorString_ = "MidiInAlsa::openPort: ALSA error allocation port subscription.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    snd_seq_port_subscribe_set_sender( data->subscription, &sender );
    snd_seq_port_subscribe_set_dest( data->subscription, &receiver );
    if ( snd_seq_subscribe_port( data->seq, data->subscription ) ) {
      snd_seq_port_subscribe_free( data->subscription );
      data->subscription = 0;
      errorString_ = "MidiInAlsa::openPort: ALSA error making port connection.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
  }

  if ( inputData_.doInput == false ) {
    // Start the input queue
#ifndef AVOID_TIMESTAMPING
    snd_seq_start_queue( data->seq, data->queue_id, NULL );
    snd_seq_drain_output( data->seq );
#endif
    // Start our MIDI input thread.
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );

    inputData_.doInput = true;
    int err = pthread_create( &data->thread, &attr, alsaMidiHandler, &inputData_ );
    pthread_attr_destroy( &attr );
    if ( err ) {
      snd_seq_unsubscribe_port( data->seq, data->subscription );
      snd_seq_port_subscribe_free( data->subscription );
      data->subscription = 0;
      inputData_.doInput = false;
      errorString_ = "MidiInAlsa::openPort: error starting MIDI input thread!";
      error( RtMidiError::THREAD_ERROR, errorString_ );
      return;
    }
  }

  connected_ = true;
}